

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_fe *r_00;
  secp256k1_fe t;
  secp256k1_fe s;
  secp256k1_fe l;
  
  secp256k1_gej_verify(a);
  r->infinity = a->infinity;
  secp256k1_fe_mul(&r->z,&a->z,&a->y);
  secp256k1_fe_sqr(&s,&a->y);
  secp256k1_fe_sqr(&l,&a->x);
  secp256k1_fe_mul_int_unchecked(&l,3);
  secp256k1_fe_half(&l);
  secp256k1_fe_negate_unchecked(&t,&s,1);
  secp256k1_fe_mul(&t,&t,&a->x);
  secp256k1_fe_sqr(&r->x,&l);
  secp256k1_fe_add(&r->x,&t);
  secp256k1_fe_add(&r->x,&t);
  secp256k1_fe_sqr(&s,&s);
  secp256k1_fe_add(&t,&r->x);
  r_00 = &r->y;
  secp256k1_fe_mul(r_00,&t,&l);
  secp256k1_fe_add(r_00,&s);
  secp256k1_fe_negate_unchecked(r_00,r_00,2);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 8 add/half/mul_int/negate */
    secp256k1_fe l, s, t;

    secp256k1_gej_verify(a);
    r->infinity = a->infinity;

    /* Formula used:
     * L = (3/2) * X1^2
     * S = Y1^2
     * T = -X1*S
     * X3 = L^2 + 2*T
     * Y3 = -(L*(X3 + T) + S^2)
     * Z3 = Y1*Z1
     */

    secp256k1_fe_mul(&r->z, &a->z, &a->y); /* Z3 = Y1*Z1 (1) */
    secp256k1_fe_sqr(&s, &a->y);           /* S = Y1^2 (1) */
    secp256k1_fe_sqr(&l, &a->x);           /* L = X1^2 (1) */
    secp256k1_fe_mul_int(&l, 3);           /* L = 3*X1^2 (3) */
    secp256k1_fe_half(&l);                 /* L = 3/2*X1^2 (2) */
    secp256k1_fe_negate(&t, &s, 1);        /* T = -S (2) */
    secp256k1_fe_mul(&t, &t, &a->x);       /* T = -X1*S (1) */
    secp256k1_fe_sqr(&r->x, &l);           /* X3 = L^2 (1) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + T (2) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + 2*T (3) */
    secp256k1_fe_sqr(&s, &s);              /* S' = S^2 (1) */
    secp256k1_fe_add(&t, &r->x);           /* T' = X3 + T (4) */
    secp256k1_fe_mul(&r->y, &t, &l);       /* Y3 = L*(X3 + T) (1) */
    secp256k1_fe_add(&r->y, &s);           /* Y3 = L*(X3 + T) + S^2 (2) */
    secp256k1_fe_negate(&r->y, &r->y, 2);  /* Y3 = -(L*(X3 + T) + S^2) (3) */
    secp256k1_gej_verify(r);
}